

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD::FindOrAddVertex(ON_SubD *this,double *control_net_point,double distance_tolerance)

{
  bool bVar1;
  ON_SubDVertex *local_58;
  ON_SubDVertex *v;
  ON_3dPoint P;
  double distance_tolerance_local;
  double *control_net_point_local;
  ON_SubD *this_local;
  
  if (control_net_point == (double *)0x0) {
    this_local = (ON_SubD *)0x0;
  }
  else {
    P.z = distance_tolerance;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&v,control_net_point);
    bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)&v);
    if (bVar1) {
      if (0.0 <= P.z) {
        local_58 = FindVertex(this,(double *)&v,P.z);
        if (local_58 == (ON_SubDVertex *)0x0) {
          local_58 = AddVertex(this,(double *)&v);
        }
        this_local = (ON_SubD *)local_58;
      }
      else {
        this_local = (ON_SubD *)0x0;
      }
    }
    else {
      this_local = (ON_SubD *)0x0;
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const ON_SubDVertex* ON_SubD::FindOrAddVertex(
  const double* control_net_point,
  double distance_tolerance
)
{
  if (nullptr == control_net_point)
    return nullptr;
  const ON_3dPoint P(control_net_point);
  if (false == P.IsValid())
    return nullptr;
  if (false == (0.0 <= distance_tolerance))
    return nullptr;
  const ON_SubDVertex* v = FindVertex(&P.x, distance_tolerance);
  return (nullptr != v) ? v : AddVertex(&P.x);
}